

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  U32 mls;
  U32 in_stack_00000008;
  
  if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
    uVar1 = (ms->cParams).minMatch;
    mls = 4;
    if (uVar1 - 5 < 3) {
      mls = uVar1;
    }
    sVar2 = ZSTD_compressBlock_fast_extDict_generic
                      (ms,seqStore,rep,src,srcSize,mls,in_stack_00000008);
    return sVar2;
  }
  __assert_fail("ms->dictMatchState == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                ,0x3b3,
                "size_t ZSTD_compressBlock_fast_extDict(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressBlock_fast_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_extDict_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_extDict_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_extDict_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_extDict_7_0(ms, seqStore, rep, src, srcSize);
    }
}